

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  runtime_error *this_00;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [64];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x25,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  if (i < this->m_) {
    pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
    if (lVar3 != this->n_) {
      __assert_fail("vec.size() == n_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                    ,0x27,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
    }
    if (lVar3 < 1) {
      auVar5 = ZEXT864(0);
    }
    else {
      auVar5 = ZEXT864(0);
      lVar4 = 0;
      do {
        auVar2 = vfmadd231ss_fma(auVar5._0_16_,
                                 ZEXT416((uint)(this->data_).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start
                                               [i * lVar3 + lVar4]),ZEXT416((uint)pfVar1[lVar4]));
        auVar5 = ZEXT1664(auVar2);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
      if (NAN(auVar2._0_4_)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Encountered NaN.");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return auVar5._0_4_;
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                ,0x26,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return d;
}